

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O0

S2Point * __thiscall
S2PaddedCell::GetEntryVertex(S2Point *__return_storage_ptr__,S2PaddedCell *this)

{
  int face;
  S2Point local_38;
  int local_1c;
  int local_18;
  int ij_size;
  uint j;
  uint i;
  S2PaddedCell *this_local;
  
  ij_size = this->ij_lo_[0];
  local_18 = this->ij_lo_[1];
  _j = this;
  if ((this->orientation_ & 2U) != 0) {
    local_1c = S2CellId::GetSizeIJ(this->level_);
    ij_size = local_1c + ij_size;
    local_18 = local_1c + local_18;
  }
  face = S2CellId::face(&this->id_);
  S2::FaceSiTitoXYZ(&local_38,face,ij_size << 1,local_18 << 1);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
            (__return_storage_ptr__,(BasicVector<Vector3,_double,_3UL> *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

S2Point S2PaddedCell::GetEntryVertex() const {
  // The curve enters at the (0,0) vertex unless the axis directions are
  // reversed, in which case it enters at the (1,1) vertex.
  unsigned int i = ij_lo_[0];
  unsigned int j = ij_lo_[1];
  if (orientation_ & kInvertMask) {
    int ij_size = S2CellId::GetSizeIJ(level_);
    i += ij_size;
    j += ij_size;
  }
  return S2::FaceSiTitoXYZ(id_.face(), 2 * i, 2 * j).Normalize();
}